

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ServiceGenerator::GenerateGetPrototype
          (ServiceGenerator *this,RequestOrResponse which,Printer *printer)

{
  int iVar1;
  char *__s;
  mapped_type *pmVar2;
  int i_00;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  Descriptor *descriptor;
  java *local_168;
  allocator<char> local_119;
  key_type local_118;
  string local_f8;
  allocator<char> local_d1;
  key_type local_d0;
  string local_b0;
  undefined1 local_90 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  MethodDescriptor *method;
  int i;
  allocator<char> local_41;
  string local_40;
  Printer *local_20;
  Printer *printer_local;
  ServiceGenerator *pSStack_10;
  RequestOrResponse which_local;
  ServiceGenerator *this_local;
  
  __s = "Response";
  if (which == REQUEST) {
    __s = "Request";
  }
  local_20 = printer;
  printer_local._4_4_ = which;
  pSStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
  io::Printer::Print(printer,
                     "public final com.google.protobuf.Message\n    get$request_or_response$Prototype(\n    com.google.protobuf.Descriptors.MethodDescriptor method) {\n  if (method.getService() != getDescriptor()) {\n    throw new java.lang.IllegalArgumentException(\n      \"Service.get$request_or_response$Prototype() given method \" +\n      \"descriptor for wrong service type.\");\n  }\n  switch(method.getIndex()) {\n"
                     ,"request_or_response",&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  io::Printer::Indent(local_20);
  io::Printer::Indent(local_20);
  method._0_4_ = 0;
  while( true ) {
    iVar1 = ServiceDescriptor::method_count(this->descriptor_);
    if (iVar1 <= (int)(uint)method) break;
    vars._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)ServiceDescriptor::method(this->descriptor_,(uint)method);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_90);
    SimpleItoa_abi_cxx11_(&local_b0,(protobuf *)(ulong)(uint)method,i_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"index",&local_d1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_90,&local_d0);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    std::__cxx11::string::~string((string *)&local_b0);
    if (printer_local._4_4_ == REQUEST) {
      local_168 = (java *)MethodDescriptor::input_type
                                    ((MethodDescriptor *)
                                     vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
      descriptor = extraout_RDX;
    }
    else {
      local_168 = (java *)MethodDescriptor::output_type
                                    ((MethodDescriptor *)
                                     vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
      descriptor = extraout_RDX_00;
    }
    ClassName_abi_cxx11_(&local_f8,local_168,descriptor);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"type",&local_119);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_90,&local_118);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    std::__cxx11::string::~string((string *)&local_f8);
    io::Printer::Print(local_20,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_90,"case $index$:\n  return $type$.getDefaultInstance();\n"
                      );
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_90);
    method._0_4_ = (uint)method + 1;
  }
  io::Printer::Print(local_20,
                     "default:\n  throw new java.lang.AssertionError(\"Can\'t get here.\");\n");
  io::Printer::Outdent(local_20);
  io::Printer::Outdent(local_20);
  io::Printer::Print(local_20,"  }\n}\n\n");
  return;
}

Assistant:

void ServiceGenerator::GenerateGetPrototype(RequestOrResponse which,
                                            io::Printer* printer) {
  /*
   * TODO(cpovirk): The exception message says "Service.foo" when it may be
   * "BlockingService.foo."  Consider fixing.
   */
  printer->Print(
    "public final com.google.protobuf.Message\n"
    "    get$request_or_response$Prototype(\n"
    "    com.google.protobuf.Descriptors.MethodDescriptor method) {\n"
    "  if (method.getService() != getDescriptor()) {\n"
    "    throw new java.lang.IllegalArgumentException(\n"
    "      \"Service.get$request_or_response$Prototype() given method \" +\n"
    "      \"descriptor for wrong service type.\");\n"
    "  }\n"
    "  switch(method.getIndex()) {\n",
    "request_or_response", (which == REQUEST) ? "Request" : "Response");
  printer->Indent();
  printer->Indent();

  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    map<string, string> vars;
    vars["index"] = SimpleItoa(i);
    vars["type"] = ClassName(
      (which == REQUEST) ? method->input_type() : method->output_type());
    printer->Print(vars,
      "case $index$:\n"
      "  return $type$.getDefaultInstance();\n");
  }

  printer->Print(
    "default:\n"
    "  throw new java.lang.AssertionError(\"Can't get here.\");\n");

  printer->Outdent();
  printer->Outdent();

  printer->Print(
    "  }\n"
    "}\n"
    "\n");
}